

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::IfStmt::set_predicate(IfStmt *this,shared_ptr<kratos::Var> *var)

{
  IRNodeKind IVar1;
  uint32_t width;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  shared_ptr<kratos::Var> *this_00;
  undefined1 local_38 [16];
  undefined1 local_28 [24];
  shared_ptr<kratos::Var> *var_local;
  IfStmt *this_local;
  
  local_28._16_8_ = var;
  var_local = (shared_ptr<kratos::Var> *)this;
  peVar3 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->predicate_stmt_);
  (*(peVar3->super_Stmt).super_IRNode._vptr_IRNode[0xc])();
  peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_28._16_8_);
  IVar1 = IRNode::ir_node_kind(&peVar4->super_IRNode);
  if (IVar1 == VarKind) {
    this_00 = &this->predicate_;
    std::shared_ptr<kratos::Var>::operator=(this_00,(shared_ptr<kratos::Var> *)local_28._16_8_);
    peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_00);
    width = (*(peVar4->super_IRNode)._vptr_IRNode[0xd])();
    peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_00);
    iVar2 = (*(peVar4->super_IRNode)._vptr_IRNode[7])();
    Generator::get_auxiliary_var((Generator *)local_38,width,SUB41(iVar2,0));
    peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
    Var::assign((Var *)local_28,(shared_ptr<kratos::Var> *)peVar4);
    std::shared_ptr<kratos::AssignStmt>::operator=
              (&this->predicate_stmt_,(shared_ptr<kratos::AssignStmt> *)local_28);
    std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_28);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_38);
    peVar3 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->predicate_stmt_);
    (*(peVar3->super_Stmt).super_IRNode._vptr_IRNode[7])(peVar3,this);
    return;
  }
  __assert_fail("var->ir_node_kind() == IRNodeKind::VarKind",
                "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/stmt.cc",0xf7,
                "void kratos::IfStmt::set_predicate(const std::shared_ptr<Var> &)");
}

Assistant:

void IfStmt::set_predicate(const std::shared_ptr<Var> &var) {
    predicate_stmt_->clear();
    assert(var->ir_node_kind() == IRNodeKind::VarKind);
    predicate_ = var;
    predicate_stmt_ =
        predicate_->generator()->get_auxiliary_var(predicate_->width())->assign(predicate_);
    predicate_stmt_->set_parent(this);
}